

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp_test.cc
# Opt level: O3

void re2::RegexpNamedCaptures(void)

{
  _Rb_tree_header *__last1;
  bool bVar1;
  int iVar2;
  Regexp *this;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *this_00;
  mapped_type *pmVar3;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  want;
  RegexpStatus status;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  local_1f0;
  RegexpStatus local_1c0;
  undefined1 local_1a0 [16];
  char *local_190 [46];
  
  local_1c0.code_ = kRegexpSuccess;
  local_1c0.error_arg_.ptr_ = (char *)0x0;
  local_1c0.error_arg_.length_ = 0;
  local_1c0.tmp_ = (string *)0x0;
  local_1a0._0_8_ = "(?P<g1>a+)|(e)(?P<g2>w*)+(?P<g1>b+)";
  local_1a0._8_4_ = 0x23;
  this = Regexp::Parse((StringPiece *)local_1a0,PerlX,&local_1c0);
  if (local_1c0.code_ != kRegexpSuccess) {
    LogMessage::LogMessage
              ((LogMessage *)local_1a0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/regexp_test.cc"
               ,0x30,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_1a0 + 8),"Check failed: status.ok()",0x19);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_1a0);
  }
  iVar2 = Regexp::NumCaptures(this);
  if (iVar2 != 4) {
    LogMessage::LogMessage
              ((LogMessage *)local_1a0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/regexp_test.cc"
               ,0x31,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_1a0 + 8),"Check failed: (4) == (x->NumCaptures())",0x27);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_1a0);
  }
  this_00 = &Regexp::NamedCaptures_abi_cxx11_(this)->_M_t;
  if (this_00 ==
      (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
       *)0x0) {
    LogMessage::LogMessage
              ((LogMessage *)local_1a0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/regexp_test.cc"
               ,0x33,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_1a0 + 8),"Check failed: have != NULL",0x1a);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_1a0);
  }
  if ((this_00->_M_impl).super__Rb_tree_header._M_node_count != 2) {
    LogMessage::LogMessage
              ((LogMessage *)local_1a0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/regexp_test.cc"
               ,0x34,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_1a0 + 8),"Check failed: (2) == (have->size())",0x23);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_1a0);
  }
  __last1 = &local_1f0._M_impl.super__Rb_tree_header;
  local_1f0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_1f0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_1f0._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_1f0._M_impl.super__Rb_tree_header._M_header._M_left = &__last1->_M_header;
  local_1f0._M_impl.super__Rb_tree_header._M_header._M_right = &__last1->_M_header;
  local_1a0._0_8_ = local_190;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a0,"g1","");
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                         *)&local_1f0,(key_type *)local_1a0);
  *pmVar3 = 1;
  if ((char **)local_1a0._0_8_ != local_190) {
    operator_delete((void *)local_1a0._0_8_);
  }
  local_1a0._0_8_ = local_190;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a0,"g2","");
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                         *)&local_1f0,(key_type *)local_1a0);
  *pmVar3 = 3;
  if ((char **)local_1a0._0_8_ != local_190) {
    operator_delete((void *)local_1a0._0_8_);
  }
  if (local_1f0._M_impl.super__Rb_tree_header._M_node_count ==
      (this_00->_M_impl).super__Rb_tree_header._M_node_count) {
    bVar1 = std::__equal<false>::
            equal<std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,int>>,std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,int>>>
                      ((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
                        )local_1f0._M_impl.super__Rb_tree_header._M_header._M_left,
                       (_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
                        )__last1,(this_00->_M_impl).super__Rb_tree_header._M_header._M_left);
    if (bVar1) goto LAB_0010cd08;
  }
  LogMessage::LogMessage
            ((LogMessage *)local_1a0,
             "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/regexp_test.cc"
             ,0x39,3);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)(local_1a0 + 8),"Check failed: (want) == (*have)",0x1f);
  LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_1a0);
LAB_0010cd08:
  Regexp::Decref(this);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::~_Rb_tree(this_00);
  operator_delete(this_00);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::~_Rb_tree(&local_1f0);
  RegexpStatus::~RegexpStatus(&local_1c0);
  return;
}

Assistant:

TEST(Regexp, NamedCaptures) {
  Regexp* x;
  RegexpStatus status;
  x = Regexp::Parse(
      "(?P<g1>a+)|(e)(?P<g2>w*)+(?P<g1>b+)", Regexp::PerlX, &status);
  EXPECT_TRUE(status.ok());
  EXPECT_EQ(4, x->NumCaptures());
  const map<string, int>* have = x->NamedCaptures();
  EXPECT_TRUE(have != NULL);
  EXPECT_EQ(2, have->size());  // there are only two named groups in
                               // the regexp: 'g1' and 'g2'.
  map<string, int> want;
  want["g1"] = 1;
  want["g2"] = 3;
  EXPECT_EQ(want, *have);
  x->Decref();
  delete have;
}